

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O0

DescriptorFlags __thiscall
Js::JavascriptProxy::GetSetter
          (JavascriptProxy *this,PropertyId propertyId,Var *setterValueOrProxy,
          PropertyValueInfo *info,ScriptContext *requestContext)

{
  ScriptContext *requestContext_local;
  PropertyValueInfo *info_local;
  Var *setterValueOrProxy_local;
  PropertyId propertyId_local;
  JavascriptProxy *this_local;
  
  *setterValueOrProxy = this;
  PropertyValueInfo::SetNoCache(info,(RecyclableObject *)this);
  PropertyValueInfo::DisablePrototypeCache(info,(RecyclableObject *)this);
  return Proxy;
}

Assistant:

DescriptorFlags JavascriptProxy::GetSetter(PropertyId propertyId, Var* setterValueOrProxy, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        // This is called when we walk prototype chain looking for setter. It is part of the [[set]] operation, but we don't need to restrict the
        // code to mimic the 'one step prototype chain lookup' spec letter. Current code structure is enough.
        *setterValueOrProxy = this;
        PropertyValueInfo::SetNoCache(info, this);
        PropertyValueInfo::DisablePrototypeCache(info, this); // We can't cache prototype property either
        return DescriptorFlags::Proxy;
    }